

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

void duckdb_je_arena_set(uint ind,arena_t *arena)

{
  duckdb_je_arenas[ind].repr = arena;
  return;
}

Assistant:

void
arena_set(unsigned ind, arena_t *arena) {
	atomic_store_p(&arenas[ind], arena, ATOMIC_RELEASE);
}